

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

Sub * google::protobuf::compiler::cpp::GetEmitRepeatedFieldGetterSub
                (Sub *__return_storage_ptr__,Options *options,Printer *p)

{
  anon_class_1_0_00000001 local_131;
  string local_130;
  string local_110;
  anon_class_16_2_37da2c3b_for_cb local_f0;
  Sub local_e0;
  
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"getter","");
  local_f0.options = options;
  local_f0.p = p;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::GetEmitRepeatedFieldGetterSub(google::protobuf::compiler::cpp::Options_const&,google::protobuf::io::Printer*)::_lambda()_1_>
            (&local_e0,&local_130,&local_f0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  io::Printer::Sub::WithSuffix(__return_storage_ptr__,&local_e0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_e0.annotation_.
      super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload
      .super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
      true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               &local_e0.annotation_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.value_.consume_after._M_dataplus._M_p != &local_e0.value_.consume_after.field_2) {
    operator_delete(local_e0.value_.consume_after._M_dataplus._M_p,
                    local_e0.value_.consume_after.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr
    [local_e0.value_.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     _M_index]._M_data)(&local_131,&local_e0.value_.value);
  local_e0.value_.value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index =
       0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.key_._M_dataplus._M_p != &local_e0.key_.field_2) {
    operator_delete(local_e0.key_._M_dataplus._M_p,local_e0.key_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto GetEmitRepeatedFieldGetterSub(const Options& options,
                                          io::Printer* p) {
  return io::Printer::Sub{
      "getter",
      [&options, p] {
        switch (options.bounds_check_mode) {
          case BoundsCheckMode::kNoEnforcement:
            p->Emit(R"cc(_internal_$name_internal$().Get(index))cc");
            break;
          case BoundsCheckMode::kReturnDefaultValue:
            p->Emit(R"cc(
              $pbi$::CheckedGetOrDefault(_internal_$name_internal$(), index)
            )cc");
            break;
          case BoundsCheckMode::kAbort:
            p->Emit(R"cc(
              $pbi$::CheckedGetOrAbort(_internal_$name_internal$(), index)
            )cc");
            break;
        }
      }}
      .WithSuffix("");
}